

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t
zesVFManagementGetVFEngineUtilizationExp2
          (zes_vf_handle_t hVFhandle,uint32_t *pCount,zes_vf_util_engine_exp2_t *pEngineUtil)

{
  zes_pfnVFManagementGetVFEngineUtilizationExp2_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnVFManagementGetVFEngineUtilizationExp2_t pfnGetVFEngineUtilizationExp2;
  zes_vf_util_engine_exp2_t *pEngineUtil_local;
  uint32_t *pCount_local;
  zes_vf_handle_t hVFhandle_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->VFManagementExp).pfnGetVFEngineUtilizationExp2;
    if (p_Var1 == (zes_pfnVFManagementGetVFEngineUtilizationExp2_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hVFhandle_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hVFhandle_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hVFhandle_local._4_4_ = (*p_Var1)(hVFhandle,pCount,pEngineUtil);
    }
  }
  else {
    hVFhandle_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hVFhandle_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesVFManagementGetVFEngineUtilizationExp2(
    zes_vf_handle_t hVFhandle,                      ///< [in] Sysman handle for the component.
    uint32_t* pCount,                               ///< [in,out] Pointer to the number of VF engine stats descriptors.
                                                    ///<  - if count is zero, the driver shall update the value with the total
                                                    ///< number of engine stats available.
                                                    ///<  - if count is greater than the total number of engine stats
                                                    ///< available, the driver shall update the value with the correct number
                                                    ///< of engine stats available.
    zes_vf_util_engine_exp2_t* pEngineUtil          ///< [in,out][optional][range(0, *pCount)] array of engine group activity counters.
                                                    ///<  - if count is less than the total number of engine stats available,
                                                    ///< then driver shall only retrieve that number of stats.
                                                    ///<  - the implementation shall populate the vector pCount-1 number of VF
                                                    ///< engine stats.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnVFManagementGetVFEngineUtilizationExp2_t pfnGetVFEngineUtilizationExp2 = [&result] {
        auto pfnGetVFEngineUtilizationExp2 = ze_lib::context->zesDdiTable.load()->VFManagementExp.pfnGetVFEngineUtilizationExp2;
        if( nullptr == pfnGetVFEngineUtilizationExp2 ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetVFEngineUtilizationExp2;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetVFEngineUtilizationExp2( hVFhandle, pCount, pEngineUtil );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetVFEngineUtilizationExp2 = ze_lib::context->zesDdiTable.load()->VFManagementExp.pfnGetVFEngineUtilizationExp2;
    if( nullptr == pfnGetVFEngineUtilizationExp2 ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetVFEngineUtilizationExp2( hVFhandle, pCount, pEngineUtil );
    #endif
}